

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::IsAttributeSet
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,uint32 index,PropertyAttributes attr)

{
  bool bVar1;
  uint uVar2;
  IndexPropertyDescriptor *local_20;
  IndexPropertyDescriptor *descriptor;
  
  bVar1 = IndexPropertyDescriptorMap::TryGetReference((this->indexPropertyMap).ptr,index,&local_20);
  if (bVar1) {
    uVar2 = 1;
    if ((local_20->Attributes & 8) == 0) {
      uVar2 = (uint)(attr & local_20->Attributes);
    }
  }
  else {
    uVar2 = (uint)(attr & this->dataItemAttributes);
  }
  return uVar2;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::IsAttributeSet(uint32 index, PropertyAttributes attr)
    {
        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (!(descriptor->Attributes & PropertyDeleted))
            {
                return descriptor->Attributes & attr;
            }
        }
        else
        {
            return GetDataItemAttributes() & attr;
        }

        return true;
    }